

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

void __thiscall
SQCompilation::CheckerVisitor::checkBoolIndex(CheckerVisitor *this,GetSlotExpr *expr)

{
  Expr *pEVar1;
  ulong uVar2;
  
  if (this->effectsOnly == false) {
    pEVar1 = maybeEval(this,(expr->super_SlotAccessExpr)._key,false);
    uVar2 = (ulong)(pEVar1->super_Node)._op;
    if ((uVar2 < 0x32) && ((0x20003ec000000U >> (uVar2 & 0x3f) & 1) != 0)) {
      report(this,&((expr->super_SlotAccessExpr)._key)->super_Node,0x4b);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkBoolIndex(const GetSlotExpr *expr) {

  if (effectsOnly)
    return;

  const Expr *key = maybeEval(expr->key())->asExpression();

  if (isBooleanResultOperator(key->op())) {
    report(expr->key(), DiagnosticsId::DI_BOOL_AS_INDEX);
  }
}